

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O2

void __thiscall
ProtocolTCP::ProcessRx(ProtocolTCP *this,DataBuffer *rxBuffer,uint8_t *sourceIP,uint8_t *targetIP)

{
  osQueue *this_00;
  uint8_t *packet;
  byte bVar1;
  uint16_t uVar2;
  uint16_t localPort;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  TCPConnection *this_01;
  TCPConnection *pTVar7;
  uint64_t uVar8;
  DataBuffer *buffer;
  int iVar9;
  uint8_t uVar10;
  bool bVar11;
  
  packet = rxBuffer->Packet;
  uVar2 = ComputeChecksum(packet,rxBuffer->Length,sourceIP,targetIP);
  if (uVar2 != 0) {
    puts("TCP Checksum Failure");
    return;
  }
  uVar2 = Unpack16(packet,0);
  localPort = Unpack16(packet,2);
  uVar4 = Unpack32(packet,4);
  uVar5 = Unpack32(packet,8);
  bVar1 = Unpack8(packet,0xc);
  bVar1 = bVar1 >> 2 & 0x3c;
  uVar3 = Unpack16(packet,0xe);
  rxBuffer->Packet = rxBuffer->Packet + bVar1;
  rxBuffer->Length = rxBuffer->Length - (ushort)bVar1;
  this_01 = LocateConnection(this,uVar2,sourceIP,localPort);
  if (this_01 == (TCPConnection *)0x0) {
    printf("Connection port %d not found\n",(ulong)localPort);
    return;
  }
  switch(this_01->State) {
  case CLOSED:
    Reset(this,rxBuffer->MAC,localPort,uVar2,sourceIP);
    break;
  case LISTEN:
    if ((packet[0xd] & 2) != 0) {
      pTVar7 = NewClient(this,rxBuffer->MAC,sourceIP,uVar2,localPort);
      if (pTVar7 == (TCPConnection *)0x0) {
        puts("Failed to get connection for SYN");
      }
      else {
        TCPConnection::Allocate(pTVar7,rxBuffer->MAC);
        pTVar7->Parent = this_01;
        pTVar7->State = SYN_RECEIVED;
        pTVar7->LastAck = uVar4;
        pTVar7->AcknowledgementNumber = uVar4 + 1;
        TCPConnection::SendFlags(pTVar7,'\x12');
        pTVar7->SequenceNumber = pTVar7->SequenceNumber + 1;
        this_01 = pTVar7;
      }
    }
    break;
  case SYN_SENT:
    if ((packet[0xd] & 2) == 0) break;
    this_01->AcknowledgementNumber = uVar4;
    this_01->LastAck = uVar4;
    if ((packet[0xd] & 0x10) != 0) {
      this_01->State = ESTABLISHED;
      goto LAB_00106a99;
    }
    this_01->State = SYN_RECEIVED;
    this_01->AcknowledgementNumber = uVar4 + 1;
    uVar10 = '\x12';
    goto LAB_00106a9b;
  case SYN_RECEIVED:
    if ((packet[0xd] & 0x10) != 0) {
      this_01->State = ESTABLISHED;
      pTVar7 = this_01->Parent;
      if (pTVar7->NewConnection == (TCPConnection *)0x0) {
        this_01->MaxSequenceTx = uVar5 + uVar3;
        pTVar7->NewConnection = this_01;
        osEvent::Notify(&pTVar7->Event);
      }
    }
    break;
  case ESTABLISHED:
    if ((packet[0xd] & 1) == 0) break;
    this_01->State = CLOSE_WAIT;
    goto LAB_00106a94;
  case FIN_WAIT_1:
    bVar1 = packet[0xd];
    if ((bVar1 & 1) == 0) {
      if ((bVar1 & 0x10) != 0) {
        this_01->State = FIN_WAIT_2;
      }
      break;
    }
    this_01->State = (bVar1 & 0x10) >> 3 | CLOSING;
LAB_00106a94:
    this_01->AcknowledgementNumber = this_01->AcknowledgementNumber + 1;
LAB_00106a99:
    uVar10 = '\x10';
LAB_00106a9b:
    TCPConnection::SendFlags(this_01,uVar10);
    break;
  case FIN_WAIT_2:
    if ((packet[0xd] & 1) == 0) break;
    this_01->State = TIMED_WAIT;
    this_01->AcknowledgementNumber = this_01->AcknowledgementNumber + 1;
    uVar8 = osTime::GetTime();
    this_01->Time_us = (uint32_t)uVar8;
    goto LAB_00106a99;
  case LAST_ACK:
    if ((packet[0xd] & 0x10) != 0) {
      this_01->State = CLOSED;
    }
  }
  if ((this_01->State & ~SYN_RECEIVED) == ESTABLISHED) {
    uVar2 = rxBuffer->Length;
    this_01->MaxSequenceTx = uVar3 + uVar5;
    osEvent::Notify(&this_01->Event);
    bVar1 = packet[0xd];
    if ((bVar1 & 0x10) != 0) {
      osMutex::Take(&this_01->HoldingQueueLock,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/ProtocolTCP.cpp"
                    ,0xe0);
      this_00 = &this_01->HoldingQueue;
      iVar6 = osQueue::GetCount(this_00);
      uVar8 = osTime::GetTime();
      iVar9 = 0;
      if (0 < iVar6) {
        iVar9 = iVar6;
      }
      while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
        buffer = (DataBuffer *)osQueue::Get(this_00);
        if ((int)(uVar5 - buffer->AcknowledgementNumber) < 0) {
          osQueue::Put(this_00,buffer);
        }
        else {
          TCPConnection::CalculateRTT(this_01,(int)uVar8 - buffer->Time_us);
          ProtocolIPv4::FreeTxBuffer(this->IP,buffer);
        }
      }
      osMutex::Give(&this_01->HoldingQueueLock);
      bVar1 = packet[0xd];
    }
    bVar11 = true;
    if (((bVar1 & 1) == 0) || ((this_01->State & ~LISTEN) != ESTABLISHED)) {
      uVar10 = '\0';
    }
    else {
      this_01->State = CLOSE_WAIT;
      uVar10 = '\x10';
      bVar11 = false;
    }
    if (uVar2 != 0) {
      rxBuffer->Disposable = false;
      TCPConnection::StoreRxData(this_01,rxBuffer);
      ProtocolIPv4::FreeRxBuffer(this->IP,rxBuffer);
      osEvent::Notify(&this_01->Event);
    }
    if (!bVar11) {
      TCPConnection::SendFlags(this_01,uVar10);
      return;
    }
  }
  return;
}

Assistant:

void ProtocolTCP::ProcessRx(DataBuffer* rxBuffer, const uint8_t* sourceIP, const uint8_t* targetIP)
{
    TCPConnection* connection;
    uint16_t checksum;
    uint16_t localPort;
    uint16_t remotePort;
    uint8_t headerLength;
    uint8_t* data;
    uint16_t dataLength;
    int count;
    DataBuffer* buffer;
    uint8_t flags = 0;
    uint8_t* packet = rxBuffer->Packet;
    uint16_t length = rxBuffer->Length;
    uint16_t remoteWindowSize;
    uint32_t time_us;

    uint32_t SequenceNumber;
    uint32_t AcknowledgementNumber;

    checksum = ComputeChecksum(packet, length, sourceIP, targetIP);

    if (checksum == 0)
    {
        // pass
        remotePort = Unpack16(packet, 0);
        localPort = Unpack16(packet, 2);
        SequenceNumber = Unpack32(packet, 4);
        AcknowledgementNumber = Unpack32(packet, 8);
        headerLength = (Unpack8(packet, 12) >> 4) * 4;
        remoteWindowSize = Unpack16(packet, 14);

        rxBuffer->Packet += headerLength;
        rxBuffer->Length -= headerLength;

        connection = LocateConnection(remotePort, sourceIP, localPort);
        if (connection == nullptr)
        {
            // No connection found
            printf("Connection port %d not found\n", localPort);
        }
        else
        {
            // Existing connection, process the state machine
            switch (connection->State)
            {
            case TCPConnection::CLOSED:
                // Do nothing
                Reset(rxBuffer->MAC, localPort, remotePort, sourceIP);
                break;
            case TCPConnection::LISTEN:
                if (SYN)
                {
                    // Need a closed connection to work with
                    TCPConnection* tmp = NewClient(rxBuffer->MAC, sourceIP, remotePort, localPort);
                    if (tmp != nullptr)
                    {
                        tmp->Allocate(rxBuffer->MAC);
                        tmp->Parent = connection;
                        connection = tmp;
                        connection->State = TCPConnection::SYN_RECEIVED;
                        connection->AcknowledgementNumber = SequenceNumber;
                        connection->LastAck = connection->AcknowledgementNumber;
                        connection->AcknowledgementNumber++; // SYN flag consumes a sequence number
                        connection->SendFlags(FLAG_SYN | FLAG_ACK);
                        connection->SequenceNumber++; // Our SYN costs too
                    }
                    else
                    {
                        printf("Failed to get connection for SYN\n");
                    }
                }
                break;
            case TCPConnection::SYN_SENT:
                if (SYN)
                {
                    connection->AcknowledgementNumber = SequenceNumber;
                    connection->LastAck = connection->AcknowledgementNumber;
                    if (ACK)
                    {
                        connection->State = TCPConnection::ESTABLISHED;
                        connection->SendFlags(FLAG_ACK);
                    }
                    else
                    {
                        // Simultaneous open
                        connection->State = TCPConnection::SYN_RECEIVED;
                        connection->AcknowledgementNumber++; // SYN flag consumes a sequence number
                        connection->SendFlags(FLAG_SYN | FLAG_ACK);
                    }
                }
                break;
            case TCPConnection::SYN_RECEIVED:
                if (ACK)
                {
                    connection->State = TCPConnection::ESTABLISHED;

                    if (connection->Parent->NewConnection == nullptr)
                    {
                        connection->MaxSequenceTx = AcknowledgementNumber + remoteWindowSize;
                        connection->Parent->NewConnection = connection;
                        connection->Parent->Event.Notify();
                    }
                }
                break;
            case TCPConnection::ESTABLISHED:
                if (FIN)
                {
                    connection->State = TCPConnection::CLOSE_WAIT;
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->SendFlags(FLAG_ACK);
                }
                break;
            case TCPConnection::FIN_WAIT_1:
                if (FIN)
                {
                    if (ACK)
                    {
                        connection->State = TCPConnection::TIMED_WAIT;
                        // Start TimedWait timer
                    }
                    else
                    {
                        connection->State = TCPConnection::CLOSING;
                    }
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->SendFlags(FLAG_ACK);
                }
                else if (ACK)
                {
                    connection->State = TCPConnection::FIN_WAIT_2;
                }
                break;
            case TCPConnection::FIN_WAIT_2:
                if (FIN)
                {
                    connection->State = TCPConnection::TIMED_WAIT;
                    // Start TimedWait timer
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->Time_us = (int32_t)osTime::GetTime();
                    connection->SendFlags(FLAG_ACK);
                }
                break;
            case TCPConnection::CLOSE_WAIT: break;
            case TCPConnection::CLOSING: break;
            case TCPConnection::LAST_ACK:
                if (ACK)
                {
                    connection->State = TCPConnection::CLOSED;
                }
                break;
            case TCPConnection::TIMED_WAIT: break;
            case TCPConnection::TTCP_PERSIST: break;
            }

            // Handle any data received
            if (connection && (connection->State == TCPConnection::ESTABLISHED ||
                               connection->State == TCPConnection::FIN_WAIT_1 ||
                               connection->State == TCPConnection::FIN_WAIT_2 ||
                               connection->State == TCPConnection::CLOSE_WAIT))
            {
                data = rxBuffer->Packet;
                dataLength = rxBuffer->Length;

                connection->MaxSequenceTx = AcknowledgementNumber + remoteWindowSize;
                connection->Event.Notify();

                // Handle any ACKed data
                if (ACK)
                {
                    connection->HoldingQueueLock.Take(__FILE__, __LINE__);
                    count = connection->HoldingQueue.GetCount();
                    time_us = (uint32_t)osTime::GetTime();
                    for (int i = 0; i < count; i++)
                    {
                        buffer = (DataBuffer*)connection->HoldingQueue.Get();
                        if ((int32_t)(AcknowledgementNumber - buffer->AcknowledgementNumber) >= 0)
                        {
                            connection->CalculateRTT((int32_t)(time_us - buffer->Time_us));
                            IP.FreeTxBuffer(buffer);
                        }
                        else
                        {
                            connection->HoldingQueue.Put(buffer);
                        }
                    }
                    connection->HoldingQueueLock.Give();
                }

                if (FIN)
                {
                    if (connection->State == TCPConnection::FIN_WAIT_1)
                    {
                        flags |= FLAG_ACK;
                        connection->State = TCPConnection::CLOSE_WAIT;
                    }
                    else if (connection->State == TCPConnection::ESTABLISHED)
                    {
                        connection->State = TCPConnection::CLOSE_WAIT;
                        flags |= FLAG_ACK;
                    }
                }

                // ACK the receipt of the data
                if (dataLength > 0)
                {
                    // Copy it to the application
                    rxBuffer->Disposable = false;
                    connection->StoreRxData(rxBuffer);
                    IP.FreeRxBuffer(rxBuffer);
                    connection->Event.Notify();
                }

                if (flags != 0)
                {
                    connection->SendFlags(flags);
                }
            }
        }
    }
    else
    {
        printf("TCP Checksum Failure\n");
    }
}